

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O2

void my_emit_message(j_common_ptr cinfo,int msg_level)

{
  jpeg_error_mgr *pjVar1;
  
  pjVar1 = cinfo->err;
  if (-1 < msg_level) {
    if (pjVar1->trace_level < msg_level) {
      return;
    }
    pjVar1 = (jpeg_error_mgr *)&pjVar1->output_message;
  }
  (*pjVar1->error_exit)(cinfo);
  return;
}

Assistant:

METHODDEF(void)
my_emit_message(j_common_ptr cinfo, int msg_level)
{
  if (msg_level < 0) {
    /* Treat warning as fatal */
    cinfo->err->error_exit(cinfo);
  } else {
    if (cinfo->err->trace_level >= msg_level)
      cinfo->err->output_message(cinfo);
  }
}